

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  ulong uVar1;
  ImGuiContext *g;
  uint uVar2;
  uint uVar3;
  ImVec2 IVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar5 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar5 = fVar5 * window->ParentWindow->FontWindowScale;
    }
    fVar6 = (GImGui->Style).FramePadding.y;
    IVar4.y = fVar6 + fVar6 + fVar5;
    IVar4.x = (window->Size).x;
  }
  else {
    IVar4 = window->Size;
  }
  fVar5 = (*padding).x;
  auVar7._0_4_ = (rect->Max).x - fVar5;
  fVar6 = (*padding).y;
  auVar7._4_4_ = (rect->Max).y - fVar6;
  auVar7._8_8_ = 0;
  fVar9 = (window->Pos).x + IVar4.x;
  fVar10 = (window->Pos).y + IVar4.y;
  fVar5 = (rect->Min).x + fVar5;
  fVar6 = (rect->Min).y + fVar6;
  uVar2 = -(uint)(fVar5 <= fVar9);
  uVar3 = -(uint)(fVar6 <= fVar10);
  uVar1 = CONCAT44(~uVar3 & (uint)fVar6,~uVar2 & (uint)fVar5) |
          CONCAT44((uint)fVar10 & uVar3,(uint)fVar9 & uVar2);
  auVar8._0_4_ = (float)uVar1 - IVar4.x;
  auVar8._4_4_ = (float)(uVar1 >> 0x20) - IVar4.y;
  auVar8._8_8_ = 0;
  auVar7 = minps(auVar7,auVar8);
  window->Pos = auVar7._0_8_;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}